

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_bool_enum_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_bool_enum_f *pf)

{
  int iVar1;
  char *pcVar2;
  flatbuffers_bool_t fVar3;
  void *pvVar4;
  flatbuffers_uoffset_t local_44;
  void *pvStack_40;
  flatbuffers_uoffset_t count;
  void *p;
  flatcc_json_printer_bool_enum_f *pf_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  if (ctx->noenum == '\0') {
    pvVar4 = get_field_ptr(td,id);
    if (pvVar4 != (void *)0x0) {
      iVar1 = td->count;
      td->count = iVar1 + 1;
      if (iVar1 != 0) {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = ',';
      }
      pvVar4 = read_uoffset_ptr(pvVar4);
      local_44 = __flatbuffers_uoffset_read_from_pe(pvVar4);
      pvStack_40 = (void *)((long)pvVar4 + 4);
      print_name(ctx,name,len);
      ctx->level = ctx->level + 1;
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '[';
      if (local_44 != 0) {
        if (ctx->indent == '\0') {
          flatcc_json_printer_flush_partial(ctx);
        }
        else {
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = '\n';
          print_indent(ctx);
        }
        fVar3 = flatbuffers_bool_read_from_pe(pvStack_40);
        (*pf)(ctx,fVar3);
        pvStack_40 = (void *)((long)pvVar4 + 5);
        local_44 = local_44 - 1;
      }
      while (local_44 != 0) {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = ',';
        if (ctx->indent == '\0') {
          flatcc_json_printer_flush_partial(ctx);
        }
        else {
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = '\n';
          print_indent(ctx);
        }
        fVar3 = flatbuffers_bool_read_from_pe(pvStack_40);
        (*pf)(ctx,fVar3);
        pvStack_40 = (void *)((long)pvStack_40 + 1);
        local_44 = local_44 - 1;
      }
      if (ctx->indent != '\0') {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = '\n';
        ctx->level = ctx->level + -1;
        print_indent(ctx);
      }
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ']';
    }
  }
  else {
    flatcc_json_printer_bool_vector_field(ctx,td,id,name,len);
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        size_t size,
        flatcc_json_printer_struct_f pf)
{
    const uint8_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        p += uoffset_size;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
            --count;
        }
        while (count--) {
            p += size;
            print_char(',');
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
        }
        print_end(']');
    }
}